

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::clear_to_size(dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                *this,size_type new_num_buckets)

{
  int iVar1;
  undefined1 auVar2 [16];
  pointer ptr;
  ulong uVar3;
  int iVar5;
  undefined1 auVar4 [16];
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  ptr = this->table;
  if (ptr == (pointer)0x0) {
    ptr = (pointer)malloc(new_num_buckets * 4);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_005fec4f;
    ptr = alloc_impl<google::libc_allocator_with_realloc<int>_>::realloc_or_die
                    ((alloc_impl<google::libc_allocator_with_realloc<int>_> *)&this->field_0x40,ptr,
                     new_num_buckets);
  }
  this->table = ptr;
LAB_005fec4f:
  auVar2 = _DAT_00a8f670;
  if (new_num_buckets != 0) {
    iVar1 = (this->key_info).empty_key;
    lVar8 = new_num_buckets - 1;
    auVar4._8_4_ = (int)lVar8;
    auVar4._0_8_ = lVar8;
    auVar4._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00a8f670;
    auVar7 = _DAT_00a8f650;
    auVar9 = _DAT_00a8f660;
    do {
      auVar10 = auVar9 ^ auVar2;
      iVar5 = auVar4._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar5 && auVar4._0_4_ < auVar10._0_4_ || iVar5 < auVar10._4_4_)
                & 1)) {
        ptr[uVar3] = iVar1;
      }
      if ((auVar10._12_4_ != auVar4._12_4_ || auVar10._8_4_ <= auVar4._8_4_) &&
          auVar10._12_4_ <= auVar4._12_4_) {
        ptr[uVar3 + 1] = iVar1;
      }
      auVar10 = auVar7 ^ auVar2;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar5 && (iVar11 != iVar5 || auVar10._0_4_ <= auVar4._0_4_)) {
        ptr[uVar3 + 2] = iVar1;
        ptr[uVar3 + 3] = iVar1;
      }
      uVar3 = uVar3 + 4;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
    } while ((new_num_buckets + 3 & 0xfffffffffffffffc) != uVar3);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar6 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar3 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar6 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_factor_;
  uVar3 = (ulong)fVar6;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar6 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }